

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascr.c
# Opt level: O2

void ascr_free(ascr_t *a)

{
  if (a != (ascr_t *)0x0) {
    if (a->senscr != (int32 *)0x0) {
      ckd_free(a->senscr);
    }
    if (a->sen_active != (uint8 *)0x0) {
      ckd_free(a->sen_active);
    }
    if (a->rec_sen_active != (uint8 *)0x0) {
      ckd_free(a->rec_sen_active);
    }
    if (a->ssid_active != (uint8 *)0x0) {
      ckd_free(a->ssid_active);
    }
    if (a->comssid_active != (uint8 *)0x0) {
      ckd_free(a->comssid_active);
    }
    if (a->cache_ci_senscr != (int32 **)0x0) {
      ckd_free_2d(a->cache_ci_senscr);
    }
    if (a->cache_best_list != (int32 *)0x0) {
      ckd_free(a->cache_best_list);
    }
    ckd_free(a);
    return;
  }
  return;
}

Assistant:

void
ascr_free(ascr_t * a)
{
    if (a) {
        if (a->senscr)
            ckd_free(a->senscr);

        if (a->sen_active)
            ckd_free((void *) a->sen_active);

        if (a->rec_sen_active)
            ckd_free((void *) a->rec_sen_active);

        if (a->ssid_active)
            ckd_free((void *) a->ssid_active);

        if (a->comssid_active)
            ckd_free((void *) a->comssid_active);

        if (a->cache_ci_senscr)
            ckd_free_2d((void **) a->cache_ci_senscr);
        if (a->cache_best_list)
            ckd_free((void *) a->cache_best_list);

        ckd_free(a);
    }

}